

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

int Gia_ManSortByValue(Gia_Obj_t **pp1,Gia_Obj_t **pp2)

{
  uint uVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int Diff;
  Gia_Obj_t **pp2_local;
  Gia_Obj_t **pp1_local;
  
  pGVar3 = Gia_Regular(*pp1);
  uVar1 = pGVar3->Value;
  pGVar3 = Gia_Regular(*pp2);
  iVar2 = uVar1 - pGVar3->Value;
  if (iVar2 < 0) {
    pp1_local._4_4_ = -1;
  }
  else if (iVar2 < 1) {
    pp1_local._4_4_ = 0;
  }
  else {
    pp1_local._4_4_ = 1;
  }
  return pp1_local._4_4_;
}

Assistant:

int Gia_ManSortByValue( Gia_Obj_t ** pp1, Gia_Obj_t ** pp2 )
{
    int Diff = Gia_Regular(*pp1)->Value - Gia_Regular(*pp2)->Value;
    if ( Diff < 0 )
        return -1;
    if ( Diff > 0 ) 
        return 1;
    return 0; 
}